

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_NtkTerSimulate_rec(Au_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int Value0;
  Au_Obj_t *pAVar3;
  char *__s1;
  Au_Ntk_t *p_00;
  Au_Obj_t *pAVar4;
  Au_Ntk_t *pModel;
  int k;
  int i;
  Au_Obj_t *pTerm;
  Au_Obj_t *pObj;
  Au_Ntk_t *p_local;
  
  pTerm = (Au_Obj_t *)0x0;
  for (pModel._4_4_ = 0; iVar1 = Vec_IntSize(&p->vPis), pModel._4_4_ < iVar1;
      pModel._4_4_ = pModel._4_4_ + 1) {
    pAVar3 = Au_NtkPi(p,pModel._4_4_);
    iVar1 = Au_ObjGetXsim(pAVar3);
    if (iVar1 < 1) {
      __assert_fail("Au_ObjGetXsim(pTerm) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                    ,0x533,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
    }
    iVar1 = Au_ObjGetXsim(pAVar3);
    if (iVar1 == 3) {
      p->pMan->nPortsNC = p->pMan->nPortsNC + 1.0;
    }
    else {
      iVar1 = Au_ObjGetXsim(pAVar3);
      if (iVar1 == 1) {
        p->pMan->nPortsC0 = p->pMan->nPortsC0 + 1.0;
      }
      else {
        p->pMan->nPortsC1 = p->pMan->nPortsC1 + 1.0;
      }
    }
  }
  __s1 = Au_NtkName(p);
  iVar1 = strcmp(__s1,"ref_egcd");
  if (iVar1 == 0) {
    printf("Replacing one instance of recursive model \"%s\" by a black box.\n","ref_egcd");
    for (pModel._4_4_ = 0; iVar1 = Vec_IntSize(&p->vPos), pModel._4_4_ < iVar1;
        pModel._4_4_ = pModel._4_4_ + 1) {
      pAVar3 = Au_NtkPo(p,pModel._4_4_);
      Au_ObjSetXsim(pAVar3,3);
    }
  }
  else {
    for (pModel._4_4_ = 0; iVar1 = Vec_IntSize(&p->vObjs), pModel._4_4_ < iVar1;
        pModel._4_4_ = pModel._4_4_ + 1) {
      pTerm = Au_NtkObjI(p,pModel._4_4_);
      iVar1 = Au_ObjIsNode(pTerm);
      if (iVar1 == 0) {
        iVar1 = Au_ObjIsBox(pTerm);
        if (iVar1 == 0) {
          iVar1 = Au_ObjIsConst0(pTerm);
          if (iVar1 != 0) {
            Au_ObjSetXsim(pTerm,1);
          }
        }
        else {
          p_00 = Au_ObjModel(pTerm);
          iVar1 = Au_ObjFaninNum(pTerm);
          iVar2 = Au_NtkPiNum(p_00);
          if (iVar1 != iVar2) {
            __assert_fail("Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x552,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
          }
          iVar1 = Au_BoxFanoutNum(pTerm);
          iVar2 = Au_NtkPoNum(p_00);
          if (iVar1 != iVar2) {
            __assert_fail("Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x553,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
          }
          for (pModel._0_4_ = 0; iVar1 = Au_ObjFaninNum(pTerm), (int)pModel < iVar1;
              pModel._0_4_ = (int)pModel + 1) {
            pAVar3 = Au_ObjFanin(pTerm,(int)pModel);
            pAVar4 = Au_NtkPi(p_00,(int)pModel);
            iVar1 = Au_ObjGetXsim(pAVar3);
            Au_ObjSetXsim(pAVar4,iVar1);
          }
          Au_NtkTerSimulate_rec(p_00);
          for (pModel._0_4_ = 0; iVar1 = Au_BoxFanoutNum(pTerm), (int)pModel < iVar1;
              pModel._0_4_ = (int)pModel + 1) {
            pAVar3 = Au_BoxFanout(pTerm,(int)pModel);
            pAVar4 = Au_NtkPo(p_00,(int)pModel);
            iVar1 = Au_ObjGetXsim(pAVar4);
            Au_ObjSetXsim(pAVar3,iVar1);
          }
        }
      }
      else if (((uint)*(undefined8 *)pTerm & 0x3fffffff) == 1) {
        iVar1 = Au_ObjGetXsimFan0(pTerm);
        iVar2 = Au_ObjGetXsimFan1(pTerm);
        iVar1 = Au_XsimAnd(iVar1,iVar2);
        Au_ObjSetXsim(pTerm,iVar1);
      }
      else if (((uint)*(undefined8 *)pTerm & 0x3fffffff) == 2) {
        iVar1 = Au_ObjGetXsimFan0(pTerm);
        iVar2 = Au_ObjGetXsimFan1(pTerm);
        iVar1 = Au_XsimXor(iVar1,iVar2);
        Au_ObjSetXsim(pTerm,iVar1);
      }
      else {
        if (((uint)*(undefined8 *)pTerm & 0x3fffffff) != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                        ,0x54c,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
        }
        iVar1 = Au_ObjGetXsimFan0(pTerm);
        iVar2 = Au_ObjGetXsimFan1(pTerm);
        Value0 = Au_ObjGetXsimFan2(pTerm);
        iVar1 = Au_XsimMux(iVar1,iVar2,Value0);
        Au_ObjSetXsim(pTerm,iVar1);
      }
    }
    for (pModel._4_4_ = 0; iVar1 = Vec_IntSize(&p->vPos), pModel._4_4_ < iVar1;
        pModel._4_4_ = pModel._4_4_ + 1) {
      pAVar3 = Au_NtkPo(p,pModel._4_4_);
      iVar1 = Au_ObjGetXsimFan0(pTerm);
      Au_ObjSetXsim(pAVar3,iVar1);
    }
    for (pModel._4_4_ = 0; iVar1 = Vec_IntSize(&p->vPos), pModel._4_4_ < iVar1;
        pModel._4_4_ = pModel._4_4_ + 1) {
      pAVar3 = Au_NtkPo(p,pModel._4_4_);
      iVar1 = Au_ObjGetXsim(pAVar3);
      if (iVar1 < 1) {
        __assert_fail("Au_ObjGetXsim(pTerm) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                      ,0x565,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
      }
      iVar1 = Au_ObjGetXsim(pAVar3);
      if (iVar1 == 3) {
        p->pMan->nPortsNC = p->pMan->nPortsNC + 1.0;
      }
      else {
        iVar1 = Au_ObjGetXsim(pAVar3);
        if (iVar1 == 1) {
          p->pMan->nPortsC0 = p->pMan->nPortsC0 + 1.0;
        }
        else {
          p->pMan->nPortsC1 = p->pMan->nPortsC1 + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void Au_NtkTerSimulate_rec( Au_Ntk_t * p )
{ 
    Au_Obj_t * pObj = NULL, * pTerm;
    int i, k;
    Au_NtkForEachPi( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
    if ( strcmp(Au_NtkName(p), "ref_egcd") == 0 )
    {
        printf( "Replacing one instance of recursive model \"%s\" by a black box.\n", "ref_egcd" );
        Au_NtkForEachPo( p, pTerm, i )
            Au_ObjSetXsim( pTerm, AU_VALX );
        return;
    }
    Au_NtkForEachObj( p, pObj, i )
    {
        if ( Au_ObjIsNode(pObj) )
        {
            if ( pObj->Func == 1 )
                Au_ObjSetXsim( pObj, Au_XsimAnd(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 2 )
                Au_ObjSetXsim( pObj, Au_XsimXor(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 3 )
                Au_ObjSetXsim( pObj, Au_XsimMux(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj), Au_ObjGetXsimFan2(pObj)) );
            else assert( 0 );
        }
        else if ( Au_ObjIsBox(pObj) )
        {
            Au_Ntk_t * pModel = Au_ObjModel(pObj);
            // check the match between the number of actual and formal parameters
            assert( Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel) );
            assert( Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel) );
            // assign PIs
            Au_ObjForEachFanin( pObj, pTerm, k )
                Au_ObjSetXsim( Au_NtkPi(pModel, k), Au_ObjGetXsim(pTerm) );
            // call recursively
            Au_NtkTerSimulate_rec( pModel );
            // assign POs
            Au_BoxForEachFanout( pObj, pTerm, k )
                Au_ObjSetXsim( pTerm, Au_ObjGetXsim(Au_NtkPo(pModel, k)) );
        }
        else if ( Au_ObjIsConst0(pObj) )
            Au_ObjSetXsim( pObj, AU_VAL0 );
            
    }
    Au_NtkForEachPo( p, pTerm, i )
        Au_ObjSetXsim( pTerm, Au_ObjGetXsimFan0(pObj) );
    Au_NtkForEachPo( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
}